

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileTargetGenerator::cmMakefileTargetGenerator
          (cmMakefileTargetGenerator *this,cmGeneratorTarget *target)

{
  _Rb_tree_header *p_Var1;
  cmGlobalUnixMakefileGenerator3 *pcVar2;
  cmake *pcVar3;
  cmState *this_00;
  bool bVar4;
  cmLocalUnixMakefileGenerator3 *pcVar5;
  char *val;
  MacOSXContentGeneratorType *pMVar6;
  string local_50;
  
  cmCommonTargetGenerator::cmCommonTargetGenerator(&this->super_cmCommonTargetGenerator,target);
  (this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmMakefileTargetGenerator_005d8f60;
  (this->BuildFileName)._M_dataplus._M_p = (pointer)&(this->BuildFileName).field_2;
  (this->BuildFileName)._M_string_length = 0;
  (this->BuildFileName).field_2._M_local_buf[0] = '\0';
  (this->BuildFileNameFull)._M_dataplus._M_p = (pointer)&(this->BuildFileNameFull).field_2;
  (this->BuildFileNameFull)._M_string_length = 0;
  (this->BuildFileNameFull).field_2._M_local_buf[0] = '\0';
  (this->ProgressFileNameFull)._M_dataplus._M_p = (pointer)&(this->ProgressFileNameFull).field_2;
  (this->ProgressFileNameFull)._M_string_length = 0;
  (this->ProgressFileNameFull).field_2._M_local_buf[0] = '\0';
  (this->TargetBuildDirectory)._M_dataplus._M_p = (pointer)&(this->TargetBuildDirectory).field_2;
  (this->TargetBuildDirectory)._M_string_length = 0;
  (this->TargetBuildDirectory).field_2._M_local_buf[0] = '\0';
  (this->TargetBuildDirectoryFull)._M_dataplus._M_p =
       (pointer)&(this->TargetBuildDirectoryFull).field_2;
  (this->TargetBuildDirectoryFull)._M_string_length = 0;
  (this->TargetBuildDirectoryFull).field_2._M_local_buf[0] = '\0';
  (this->FlagFileNameFull)._M_dataplus._M_p = (pointer)&(this->FlagFileNameFull).field_2;
  (this->FlagFileNameFull)._M_string_length = 0;
  (this->FlagFileNameFull).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->InfoFileNameFull)._M_dataplus._M_p = (pointer)&(this->InfoFileNameFull).field_2;
  (this->InfoFileNameFull)._M_string_length = 0;
  (this->InfoFileNameFull).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ExternalObjects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ExternalObjects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExternalObjects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CleanFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CleanFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CleanFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->TargetNames).Base._M_dataplus._M_p = (pointer)&(this->TargetNames).Base.field_2;
  (this->TargetNames).Base._M_string_length = 0;
  (this->TargetNames).Base.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).Output._M_dataplus._M_p = (pointer)&(this->TargetNames).Output.field_2;
  (this->TargetNames).Output._M_string_length = 0;
  (this->TargetNames).Output.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).Real._M_dataplus._M_p = (pointer)&(this->TargetNames).Real.field_2;
  (this->TargetNames).Real._M_string_length = 0;
  (this->TargetNames).Real.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).ImportLibrary._M_dataplus._M_p =
       (pointer)&(this->TargetNames).ImportLibrary.field_2;
  (this->TargetNames).ImportLibrary._M_string_length = 0;
  (this->TargetNames).ImportLibrary.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).PDB._M_dataplus._M_p = (pointer)&(this->TargetNames).PDB.field_2;
  (this->TargetNames).PDB._M_string_length = 0;
  (this->TargetNames).PDB.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).SharedObject._M_dataplus._M_p =
       (pointer)&(this->TargetNames).SharedObject.field_2;
  (this->TargetNames).SharedObject._M_string_length = 0;
  (this->TargetNames).SharedObject.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  this->BuildFileStream = (cmGeneratedFileStream *)0x0;
  this->InfoFileStream = (cmGeneratedFileStream *)0x0;
  this->FlagFileStream = (cmGeneratedFileStream *)0x0;
  this->CustomCommandDriver = OnBuild;
  this->MacOSXContentGenerator = (MacOSXContentGeneratorType *)0x0;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->OSXBundleGenerator = (cmOSXBundleGenerator *)0x0;
  pcVar5 = (cmLocalUnixMakefileGenerator3 *)cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = pcVar5;
  pcVar2 = (cmGlobalUnixMakefileGenerator3 *)
           (pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  this->GlobalGenerator = pcVar2;
  pcVar3 = (pcVar2->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  this->NoRuleMessages = false;
  this_00 = pcVar3->State;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"RULE_MESSAGES","");
  val = cmState::GetGlobalProperty(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (val != (char *)0x0) {
    bVar4 = cmSystemTools::IsOff(val);
    this->NoRuleMessages = bVar4;
  }
  pMVar6 = (MacOSXContentGeneratorType *)operator_new(0x10);
  (pMVar6->super_MacOSXContentGeneratorType)._vptr_MacOSXContentGeneratorType =
       (_func_int **)&PTR__MacOSXContentGeneratorType_005d8fa0;
  pMVar6->Generator = this;
  this->MacOSXContentGenerator = pMVar6;
  return;
}

Assistant:

cmMakefileTargetGenerator::cmMakefileTargetGenerator(cmGeneratorTarget* target)
  : cmCommonTargetGenerator(target)
  , OSXBundleGenerator(nullptr)
  , MacOSXContentGenerator(nullptr)
{
  this->BuildFileStream = nullptr;
  this->InfoFileStream = nullptr;
  this->FlagFileStream = nullptr;
  this->CustomCommandDriver = OnBuild;
  this->LocalGenerator =
    static_cast<cmLocalUnixMakefileGenerator3*>(target->GetLocalGenerator());
  this->GlobalGenerator = static_cast<cmGlobalUnixMakefileGenerator3*>(
    this->LocalGenerator->GetGlobalGenerator());
  cmake* cm = this->GlobalGenerator->GetCMakeInstance();
  this->NoRuleMessages = false;
  if (const char* ruleStatus =
        cm->GetState()->GetGlobalProperty("RULE_MESSAGES")) {
    this->NoRuleMessages = cmSystemTools::IsOff(ruleStatus);
  }
  MacOSXContentGenerator = new MacOSXContentGeneratorType(this);
}